

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86.cpp
# Opt level: O3

int __thiscall ncnn::LRN_x86::forward_inplace(LRN_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint _c;
  size_t _elemsize;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  int *piVar5;
  pointer piVar6;
  uint uVar7;
  _func_int *p_Var8;
  int iVar9;
  void *pvVar10;
  _func_int **pp_Var11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  void *pvVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  float fVar25;
  allocator_type local_169;
  ulong local_168;
  ulong local_160;
  Mat local_158;
  ulong local_110;
  long local_108;
  ulong local_100;
  Mat local_f8;
  long local_b0;
  void *local_a8;
  long local_a0;
  void *local_98;
  long local_90;
  void *local_88;
  long local_80;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar7 = bottom_top_blob->w;
  local_160 = (ulong)(uint)bottom_top_blob->h;
  _c = bottom_top_blob->c;
  uVar24 = (ulong)_c;
  _elemsize = bottom_top_blob->elemsize;
  local_f8.cstep = 0;
  local_f8.data = (void *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8.elemsize._4_4_ = 0;
  local_f8.elempack = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  Mat::create(&local_f8,uVar7,bottom_top_blob->h,_c,_elemsize,opt->workspace_allocator);
  iVar9 = -100;
  if ((local_f8.data == (void *)0x0) || (local_f8.cstep * (long)local_f8.c == 0)) goto LAB_001ec018;
  iVar14 = (int)local_160 * uVar7;
  if (0 < (int)_c) {
    pvVar16 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->cstep;
    sVar3 = bottom_top_blob->elemsize;
    uVar20 = 0;
    pvVar10 = local_f8.data;
    do {
      if (0 < iVar14) {
        lVar21 = 0;
        do {
          fVar1 = *(float *)((long)pvVar16 + lVar21 * 4);
          *(float *)((long)pvVar10 + lVar21 * 4) = fVar1 * fVar1;
          lVar21 = lVar21 + 1;
        } while (iVar14 != (int)lVar21);
      }
      uVar20 = uVar20 + 1;
      pvVar16 = (void *)((long)pvVar16 + sVar2 * sVar3);
      pvVar10 = (void *)((long)pvVar10 +
                        local_f8.cstep *
                        CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
    } while (uVar20 != uVar24);
  }
  pp_Var11 = this->_vptr_LRN_x86;
  iVar9 = 0;
  local_100 = uVar24;
  if (*(int *)(&this->field_0xd0 + (long)pp_Var11[-3]) == 0) {
    local_158.cstep = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elemsize._4_4_ = 0;
    local_158.elempack = 0;
    local_158.allocator = (Allocator *)0x0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    Mat::create(&local_158,uVar7,(int)local_160,_c,_elemsize,opt->workspace_allocator);
    if ((local_158.data == (void *)0x0) || (local_158.cstep * (long)local_158.c == 0)) {
      piVar5 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
joined_r0x001ebff3:
            if (local_158.data != (void *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
LAB_001ec013:
      iVar9 = -100;
      goto LAB_001ec018;
    }
    uVar7 = (int)local_158.cstep * local_158.c;
    if (0 < (int)uVar7) {
      memset(local_158.data,0,(ulong)uVar7 << 2);
    }
    if (0 < (int)_c) {
      pp_Var11 = this->_vptr_LRN_x86;
      fVar1 = *(float *)(&this->field_0xd8 + (long)pp_Var11[-3]);
      iVar9 = *(int *)(&this->field_0xd4 + (long)pp_Var11[-3]);
      pvVar16 = bottom_top_blob->data;
      local_168 = local_158.cstep *
                  CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
      local_108 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      uVar20 = 0;
      pvVar10 = local_158.data;
      do {
        p_Var8 = pp_Var11[-3];
        iVar12 = *(int *)(&this->field_0xd4 + (long)p_Var8) / 2;
        iVar15 = (int)uVar20;
        uVar7 = iVar15 - iVar12;
        if ((int)uVar7 <= iVar12 + iVar15) {
          lVar21 = local_158.cstep *
                   CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize) * uVar20;
          do {
            if (uVar7 < (uint)uVar24 && 0 < iVar14) {
              lVar19 = 0;
              do {
                *(float *)((long)local_158.data + lVar19 * 4 + lVar21) =
                     *(float *)((long)local_158.data + lVar19 * 4 + lVar21) +
                     *(float *)((long)local_f8.data +
                               lVar19 * 4 +
                               (ulong)uVar7 *
                               local_f8.cstep *
                               CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
                lVar19 = lVar19 + 1;
              } while (iVar14 != (int)lVar19);
              p_Var8 = pp_Var11[-3];
            }
            bVar4 = (int)uVar7 < *(int *)(&this->field_0xd4 + (long)p_Var8) / 2 + iVar15;
            uVar7 = uVar7 + 1;
          } while (bVar4);
        }
        if (0 < iVar14) {
          lVar21 = 0;
          do {
            fVar25 = powf(*(float *)((long)pvVar10 + lVar21 * 4) * fVar1 * (1.0 / (float)iVar9) +
                          *(float *)(&this->field_0xe0 + (long)pp_Var11[-3]),
                          -*(float *)(&this->field_0xdc + (long)pp_Var11[-3]));
            *(float *)((long)pvVar16 + lVar21 * 4) = fVar25 * *(float *)((long)pvVar16 + lVar21 * 4)
            ;
            lVar21 = lVar21 + 1;
          } while (iVar14 != (int)lVar21);
        }
        uVar20 = uVar20 + 1;
        pvVar10 = (void *)((long)pvVar10 + local_168);
        pvVar16 = (void *)((long)pvVar16 + local_108);
        uVar24 = local_100;
      } while (uVar20 != local_100);
    }
    piVar5 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    iVar9 = 0;
    if (piVar5 == (int *)0x0) goto LAB_001ec018;
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 != 0) goto LAB_001ec018;
    if (local_158.allocator != (Allocator *)0x0) {
      (*(local_158.allocator)->_vptr_Allocator[3])();
      goto LAB_001ec018;
    }
  }
  else {
    if (*(int *)(&this->field_0xd0 + (long)pp_Var11[-3]) != 1) goto LAB_001ec018;
    piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
    local_158.data = local_f8.data;
    local_158.refcount._0_4_ = local_f8.refcount._0_4_;
    local_158.refcount._4_4_ = local_f8.refcount._4_4_;
    local_158.elemsize._0_4_ = (undefined4)local_f8.elemsize;
    local_158.elemsize._4_4_ = local_f8.elemsize._4_4_;
    local_158.elempack = local_f8.elempack;
    local_158.allocator = local_f8.allocator;
    local_158.dims = local_f8.dims;
    local_158.w = local_f8.w;
    local_158.h = local_f8.h;
    local_158.d = local_f8.d;
    local_158.c = local_f8.c;
    local_158.cstep = local_f8.cstep;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
      pp_Var11 = this->_vptr_LRN_x86;
    }
    p_Var8 = pp_Var11[-3];
    uVar17 = *(uint *)(&this->field_0xd4 + (long)p_Var8);
    uVar22 = uVar7;
    if (1 < (int)uVar17) {
      uVar17 = uVar17 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      iVar9 = ~uVar17 + *(int *)(&this->field_0xd4 + (long)pp_Var11[-3]);
      copy_make_border(&local_f8,&local_158,uVar17,iVar9,uVar17,iVar9,0,0.0,(Option *)&_space_ofs);
      if ((local_158.data == (void *)0x0) || ((long)local_158.c * local_158.cstep == 0)) {
        piVar5 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_158.allocator == (Allocator *)0x0) goto joined_r0x001ebff3;
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
        goto LAB_001ec013;
      }
      p_Var8 = this->_vptr_LRN_x86[-3];
      uVar17 = *(uint *)(&this->field_0xd4 + (long)p_Var8);
      uVar22 = local_158.w;
    }
    uVar13 = uVar17 * uVar17;
    fVar1 = *(float *)(&this->field_0xd8 + (long)p_Var8);
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar13,&local_169);
    piVar6 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pp_Var11 = this->_vptr_LRN_x86;
    iVar9 = *(int *)(&this->field_0xd4 + (long)pp_Var11[-3]);
    if (0 < iVar9) {
      iVar23 = uVar22 - iVar9;
      iVar14 = 0;
      iVar12 = 0;
      iVar15 = 0;
      do {
        if (0 < iVar9) {
          lVar21 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar15 + lVar21] = iVar12 + (int)lVar21;
            iVar9 = *(int *)(&this->field_0xd4 + (long)pp_Var11[-3]);
            lVar21 = lVar21 + 1;
            iVar18 = (int)lVar21;
          } while (iVar18 < iVar9);
          iVar15 = iVar15 + iVar18;
          iVar12 = iVar12 + iVar18;
        }
        iVar12 = iVar12 + iVar23;
        iVar14 = iVar14 + 1;
      } while (iVar14 < iVar9);
    }
    if (0 < (int)_c) {
      local_80 = (long)(int)uVar7;
      local_98 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      local_a8 = local_158.data;
      local_b0 = local_158.cstep * CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize)
      ;
      local_90 = (long)local_158.w *
                 CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
      local_108 = CONCAT44(local_108._4_4_,1.0 / (float)(int)uVar13);
      local_110 = 0;
      do {
        if (0 < (int)local_160) {
          local_88 = (void *)(local_b0 * local_110 + (long)local_a8);
          pvVar16 = (void *)(local_a0 * local_110 + (long)local_98);
          pp_Var11 = this->_vptr_LRN_x86;
          local_168 = 0;
          do {
            pvVar10 = local_88;
            if (0 < (int)uVar7) {
              lVar21 = local_90 * local_168;
              uVar24 = 0;
              do {
                if (uVar17 == 0) {
                  fVar25 = 0.0;
                }
                else {
                  fVar25 = 0.0;
                  uVar20 = 0;
                  do {
                    fVar25 = fVar25 + *(float *)((long)pvVar10 +
                                                (long)piVar6[uVar20] * 4 + uVar24 * 4 + lVar21);
                    uVar20 = uVar20 + 1;
                  } while (uVar13 + (uVar13 == 0) != uVar20);
                }
                fVar25 = powf(fVar25 * fVar1 * (float)local_108 +
                              *(float *)(&this->field_0xe0 + (long)pp_Var11[-3]),
                              -*(float *)(&this->field_0xdc + (long)pp_Var11[-3]));
                *(float *)((long)pvVar16 + uVar24 * 4) =
                     fVar25 * *(float *)((long)pvVar16 + uVar24 * 4);
                uVar24 = uVar24 + 1;
              } while (uVar24 != uVar7);
            }
            pvVar16 = (void *)((long)pvVar16 + local_80 * 4);
            local_168 = local_168 + 1;
          } while (local_168 != local_160);
        }
        local_110 = local_110 + 1;
      } while (local_110 != local_100);
    }
    if (piVar6 != (pointer)0x0) {
      operator_delete(piVar6,(long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)piVar6);
    }
    piVar5 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    iVar9 = 0;
    if (piVar5 == (int *)0x0) goto LAB_001ec018;
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 != 0) goto LAB_001ec018;
    if (local_158.allocator != (Allocator *)0x0) {
      (*(local_158.allocator)->_vptr_Allocator[3])();
      goto LAB_001ec018;
    }
  }
  iVar9 = 0;
  if (local_158.data != (void *)0x0) {
    iVar9 = 0;
    free(local_158.data);
  }
LAB_001ec018:
  piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if (local_f8.data != (void *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar9;
}

Assistant:

int LRN_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}